

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
attach<kj::String>(Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                   *this,String *attachments)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *next;
  String *params;
  NoInfer<kj::String> *in_RDX;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::String> local_48;
  Own<kj::_::AttachmentPromiseNode<kj::String>,_kj::_::PromiseDisposer> local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  NoInfer<kj::String> *local_20;
  String *attachments_local;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = this;
  next = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)attachments);
  params = fwd<kj::String>(local_20);
  tuple<kj::String>(&local_48,params);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::String>,kj::_::PromiseDisposer,kj::String>
            ((PromiseDisposer *)&local_30,next,&local_48);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::Own<kj::_::AttachmentPromiseNode<kj::String>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_28,&local_30);
  Promise(this,false,(OwnPromiseNode *)&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  Own<kj::_::AttachmentPromiseNode<kj::String>,_kj::_::PromiseDisposer>::~Own(&local_30);
  String::~String(&local_48);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}